

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

void distributeMultiBox(QList<QLayoutStruct> *chain,int start,int end,int minSize,int sizeHint,
                       QList<int> *stretchArray,int stretch)

{
  pointer pQVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  
  lVar7 = (long)start;
  lVar4 = (long)end;
  lVar9 = lVar7 << 5;
  iVar6 = 0;
  iVar10 = 0;
  iVar2 = 0;
  for (lVar8 = lVar7; lVar8 <= lVar4; lVar8 = lVar8 + 1) {
    pQVar1 = QList<QLayoutStruct>::data(chain);
    if ((stretchArray->d).ptr[lVar8] == 0) {
      iVar5 = *(int *)((long)&pQVar1->stretch + lVar9);
      if (iVar5 <= stretch) {
        iVar5 = stretch;
      }
      *(int *)((long)&pQVar1->stretch + lVar9) = iVar5;
    }
    iVar5 = 0;
    if (lVar4 != lVar8) {
      iVar5 = *(int *)((long)&pQVar1->spacing + lVar9);
    }
    iVar6 = iVar6 + *(int *)((long)&pQVar1->maximumSize + lVar9) + iVar5;
    iVar10 = iVar10 + *(int *)((long)&pQVar1->sizeHint + lVar9) + iVar5;
    iVar2 = iVar2 + *(int *)((long)&pQVar1->minimumSize + lVar9) + iVar5;
    lVar9 = lVar9 + 0x20;
  }
  if (iVar6 < minSize) {
    qGeomCalc(chain,start,(end - start) + 1,0,minSize,-1);
    lVar9 = lVar7 << 5;
    iVar2 = 0;
    for (lVar8 = lVar7; lVar8 <= lVar4; lVar8 = lVar8 + 1) {
      pQVar1 = QList<QLayoutStruct>::data(chain);
      iVar6 = minSize;
      if (lVar4 != lVar8) {
        iVar6 = *(int *)((long)&(chain->d).ptr[1].pos + lVar9);
      }
      iVar5 = 0;
      if (lVar4 != lVar8) {
        iVar5 = *(int *)((long)&pQVar1->spacing + lVar9);
      }
      iVar5 = iVar6 - (iVar2 + iVar5);
      iVar2 = *(int *)((long)&pQVar1->minimumSize + lVar9);
      if (iVar2 < iVar5) {
        *(int *)((long)&pQVar1->minimumSize + lVar9) = iVar5;
        iVar2 = iVar5;
      }
      if (*(int *)((long)&pQVar1->maximumSize + lVar9) < iVar2) {
        *(int *)((long)&pQVar1->maximumSize + lVar9) = iVar2;
      }
      lVar9 = lVar9 + 0x20;
      iVar2 = iVar6;
    }
  }
  else if (iVar2 < minSize) {
    qGeomCalc(chain,start,(end - start) + 1,0,minSize,-1);
    uVar3 = lVar7 << 5 | 0xc;
    for (lVar8 = lVar7; lVar8 <= lVar4; lVar8 = lVar8 + 1) {
      pQVar1 = QList<QLayoutStruct>::data(chain);
      iVar2 = *(int *)((long)&pQVar1->spacing + uVar3);
      if (*(int *)((long)&pQVar1->stretch + uVar3) < iVar2) {
        *(int *)((long)&pQVar1->stretch + uVar3) = iVar2;
      }
      uVar3 = uVar3 + 0x20;
    }
  }
  if (iVar10 < sizeHint) {
    qGeomCalc(chain,start,(end - start) + 1,0,sizeHint,-1);
    uVar3 = lVar7 << 5 | 4;
    for (; lVar7 <= lVar4; lVar7 = lVar7 + 1) {
      pQVar1 = QList<QLayoutStruct>::data(chain);
      iVar2 = *(int *)((long)&pQVar1->pos + uVar3);
      if (*(int *)((long)&pQVar1->stretch + uVar3) < iVar2) {
        *(int *)((long)&pQVar1->stretch + uVar3) = iVar2;
      }
      uVar3 = uVar3 + 0x20;
    }
  }
  return;
}

Assistant:

static void distributeMultiBox(QList<QLayoutStruct> &chain, int start, int end, int minSize,
                               int sizeHint, QList<int> &stretchArray, int stretch)
{
    int i;
    int w = 0;
    int wh = 0;
    int max = 0;

    for (i = start; i <= end; i++) {
        QLayoutStruct *data = &chain[i];
        w += data->minimumSize;
        wh += data->sizeHint;
        max += data->maximumSize;
        if (stretchArray.at(i) == 0)
            data->stretch = qMax(data->stretch, stretch);

        if (i != end) {
            int spacing = data->spacing;
            w += spacing;
            wh += spacing;
            max += spacing;
        }
    }

    if (max < minSize) { // implies w < minSize
        /*
          We must increase the maximum size of at least one of the
          items. qGeomCalc() will put the extra space in between the
          items. We must recover that extra space and put it
          somewhere. It does not really matter where, since the user
          can always specify stretch factors and avoid this code.
        */
        qGeomCalc(chain, start, end - start + 1, 0, minSize);
        int pos = 0;
        for (i = start; i <= end; i++) {
            QLayoutStruct *data = &chain[i];
            int nextPos = (i == end) ? minSize : chain.at(i + 1).pos;
            int realSize = nextPos - pos;
            if (i != end)
                realSize -= data->spacing;
            if (data->minimumSize < realSize)
                data->minimumSize = realSize;
            if (data->maximumSize < data->minimumSize)
                data->maximumSize = data->minimumSize;
            pos = nextPos;
        }
    } else if (w < minSize) {
        qGeomCalc(chain, start, end - start + 1, 0, minSize);
        for (i = start; i <= end; i++) {
            QLayoutStruct *data = &chain[i];
            if (data->minimumSize < data->size)
                data->minimumSize = data->size;
        }
    }

    if (wh < sizeHint) {
        qGeomCalc(chain, start, end - start + 1, 0, sizeHint);
        for (i = start; i <= end; i++) {
            QLayoutStruct *data = &chain[i];
            if (data->sizeHint < data->size)
                data->sizeHint = data->size;
        }
    }
}